

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_inmem_snapshot_seek_test(bool flush_wal)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  char *__format;
  undefined7 in_register_00000039;
  ulong uVar5;
  long lVar6;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  undefined4 local_494;
  fdb_kvs_config kvs_config;
  fdb_doc *apfStack_478 [6];
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fVar3 = fdb_open(&dbfile,"./iterator_test1",&fconfig);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x619);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x619,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  local_494 = (undefined4)CONCAT71(in_register_00000039,flush_wal);
  fVar3 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x61b);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x61b,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  lVar6 = 0;
  for (uVar5 = 0; uVar5 != 5; uVar5 = uVar5 + 1) {
    sprintf(keybuf,"%c2",(ulong)((int)uVar5 + 0x61));
    sprintf(metabuf,"meta%d",uVar5 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar5 & 0xffffffff);
    keylen = strlen(keybuf);
    metalen = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_478 + lVar6),keybuf,keylen,metabuf,metalen,bodybuf,
                   bodylen);
    fdb_set(db,apfStack_478[uVar5]);
    lVar6 = lVar6 + 8;
  }
  fdb_commit(dbfile,(fdb_commit_opt_t)local_494);
  fVar3 = fdb_snapshot_open(db,&snap_db,0xffffffffffffffff);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x62f);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x62f,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fVar3 = fdb_set_log_callback(db,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x633);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x633,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fdb_iterator_init(snap_db,&iterator,"b2",2,"d2",2,0xe);
  fVar3 = fdb_iterator_seek(iterator,"c1",2,'\x01');
  if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x63e);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x63e,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fVar3 = fdb_iterator_seek(iterator,"c3",2,'\0');
  if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x643);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x643,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fdb_iterator_close(iterator);
  fdb_iterator_init(snap_db,&iterator,"b3",2,"d1",2,0xe);
  fVar3 = fdb_iterator_seek(iterator,"c1",2,'\x01');
  if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x650);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x650,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fVar3 = fdb_iterator_seek(iterator,"c3",2,'\0');
  if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x655);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x655,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fdb_iterator_close(iterator);
  fdb_iterator_init(snap_db,&iterator,"b0",2,"e2",2,0xe);
  fVar3 = fdb_iterator_seek_to_max(iterator);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x662);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x662,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fVar3 = fdb_iterator_get(iterator,&rdoc);
  pfVar2 = rdoc;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x664);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x664,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  pvVar1 = rdoc->key;
  iVar4 = bcmp(pvVar1,"d2",rdoc->keylen);
  if (iVar4 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","d2",pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x665);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x665,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fdb_doc_free(pfVar2);
  rdoc = (fdb_doc *)0x0;
  fVar3 = fdb_iterator_seek(iterator,"e2",2,'\0');
  if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x66c);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x66c,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fVar3 = fdb_iterator_seek_to_min(iterator);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x671);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x671,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fVar3 = fdb_iterator_get(iterator,&rdoc);
  pfVar2 = rdoc;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x673);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x673,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  pvVar1 = rdoc->key;
  iVar4 = bcmp(pvVar1,"c2",rdoc->keylen);
  if (iVar4 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","c2",pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x674);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x674,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fdb_doc_free(pfVar2);
  fVar3 = fdb_iterator_seek(iterator,"b0",2,'\x01');
  if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x67a);
    iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x67a,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fVar3 = fdb_iterator_seek(iterator,"b0",2,'\x01');
  if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
    fdb_iterator_close(iterator);
    fdb_kvs_close(db);
    fdb_kvs_close(snap_db);
    fdb_close(dbfile);
    for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
      fdb_doc_free(apfStack_478[lVar6]);
    }
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"in-memory snapshot seek test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x67f);
  iterator_inmem_snapshot_seek_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x67f,"void iterator_inmem_snapshot_seek_test(bool)");
}

Assistant:

void iterator_inmem_snapshot_seek_test(bool flush_wal)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    status = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "%c2",(char)i + 'a');
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    if (flush_wal) {
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }
    // ---------- Snapshot tests begin -----------------------
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_inmem_snapshot_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b2", 2, (void*)"d2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on the start key which
    // should not be returned since we have passed ITR_SKIP_MIN_KEY
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to land on the end key which
    // should not be returned since we have passed ITR_SKIP_MAX_KEY
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b3", 2, (void*)"d1", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on key that is
    // smaller than the start key which should not be returned.
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to be land on key larger than
    // end key which should not be returned.
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for just 3 items within range
    fdb_iterator_init(snap_db, &iterator, (void*)"b0", 2, (void*)"e2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to max key but skip max key
    // should return a key for fdb_iterator_seek_to_max
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "d2", rdoc->keylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // But same attempt with regular seek to max key
    // no key should be returned since we want to skip max key
    status = fdb_iterator_seek(iterator, "e2", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to min key but skip min key
    // should return a key for fdb_iterator_seek_to_min
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "c2", rdoc->keylen);
    fdb_doc_free(rdoc);

    // But same attempt with regular seek to min key
    // no key should be returned since we want to skip min key
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to key outside the range that happens to land on non-existent key
    // no key should be returned
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot seek test");
}